

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitBuffer.cpp
# Opt level: O1

TEmitBufferAllocation * __thiscall
EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_FakeCriticalSection>
::NewAllocation(EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_FakeCriticalSection>
                *this,size_t bytes,ushort pdataCount,ushort xdataSize,
               bool canAllocInPreReservedHeapPageSegment,bool isAnyJittedCode)

{
  Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *this_00;
  Allocation *pAVar1;
  TEmitBufferAllocation *pTVar2;
  Allocation *pAVar3;
  undefined7 in_register_00000089;
  undefined1 local_50 [8];
  AutoCustomHeapPointer<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>
  allocatedMemory;
  bool local_31 [8];
  bool isAllJITCodeInPreReservedRegion;
  
  local_31[0] = true;
  this_00 = &this->allocationHeap;
  allocatedMemory._allocationHeap._4_4_ = (undefined4)CONCAT71(in_register_00000089,isAnyJittedCode)
  ;
  pAVar1 = Memory::CustomHeap::
           Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::Alloc
                     (this_00,bytes,pdataCount,xdataSize,canAllocInPreReservedHeapPageSegment,
                      isAnyJittedCode,local_31);
  if (pAVar1 == (Allocation *)0x0) {
    JsUtil::ExternalApi::RecoverUnusedMemory();
    pAVar1 = Memory::CustomHeap::
             Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::Alloc
                       (this_00,bytes,pdataCount,xdataSize,canAllocInPreReservedHeapPageSegment,
                        allocatedMemory._allocationHeap._4_1_,local_31);
  }
  if (pAVar1 != (Allocation *)0x0) {
    pAVar1->field_0x28 = pAVar1->field_0x28 | 1;
    local_50 = (undefined1  [8])pAVar1;
    allocatedMemory._heapAllocation = (Allocation *)this_00;
    if (DAT_015d346a == '\x01') {
      Output::Trace(CustomHeapPhase,L"New allocation: 0x%p, size: %p\n",pAVar1->address,pAVar1->size
                   );
    }
    pTVar2 = (TEmitBufferAllocation *)new<Memory::ArenaAllocator>(0x28,this->allocator,0x366bee);
    pTVar2->bytesCommitted = pAVar1->size;
    pAVar3 = AutoCustomHeapPointer<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>
             ::Detach((AutoCustomHeapPointer<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>
                       *)local_50);
    pTVar2->allocation = pAVar3;
    pTVar2->bytesUsed = 0;
    pTVar2->nextAllocation = this->allocations;
    pTVar2->recorded = false;
    pTVar2->inPrereservedRegion = local_31[0];
    this->allocations = pTVar2;
    this->totalBytesCommitted = this->totalBytesCommitted + pAVar1->size;
    AutoCustomHeapPointer<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
    ~AutoCustomHeapPointer
              ((AutoCustomHeapPointer<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>
                *)local_50);
    return pTVar2;
  }
  Js::Throw::OutOfMemory();
}

Assistant:

EmitBufferAllocation<TAlloc, TPreReservedAlloc> *
EmitBufferManager<TAlloc, TPreReservedAlloc, SyncObject>::NewAllocation(size_t bytes, ushort pdataCount, ushort xdataSize, bool canAllocInPreReservedHeapPageSegment, bool isAnyJittedCode)
{
    FAULTINJECT_MEMORY_THROW(_u("JIT"), bytes);

    Assert(this->criticalSection.IsLocked());

    bool isAllJITCodeInPreReservedRegion = true;
    CustomHeap::Allocation* heapAllocation = this->allocationHeap.Alloc(bytes, pdataCount, xdataSize, canAllocInPreReservedHeapPageSegment, isAnyJittedCode, &isAllJITCodeInPreReservedRegion);

    if (heapAllocation  == nullptr)
    {
        if (!JITManager::GetJITManager()->IsJITServer())
        {
            // This is used in interpreter scenario, thus we need to try to recover memory, if possible.
            // Can't simply throw as in JIT scenario, for which throw is what we want in order to give more mem to interpreter.
            JsUtil::ExternalApi::RecoverUnusedMemory();
            heapAllocation = this->allocationHeap.Alloc(bytes, pdataCount, xdataSize, canAllocInPreReservedHeapPageSegment, isAnyJittedCode, &isAllJITCodeInPreReservedRegion);
        }
    }

    if (heapAllocation  == nullptr)
    {
        Js::Throw::OutOfMemory();
    }

#if DBG
    heapAllocation->isAllocationUsed = true;
#endif

    AutoCustomHeapPointer<TAlloc, TPreReservedAlloc> allocatedMemory(&this->allocationHeap, heapAllocation);
    VerboseHeapTrace(_u("New allocation: 0x%p, size: %p\n"), heapAllocation->address, heapAllocation->size);
    TEmitBufferAllocation * allocation = AnewStruct(this->allocator, TEmitBufferAllocation);

    allocation->bytesCommitted = heapAllocation->size;
    allocation->allocation = allocatedMemory.Detach();
    allocation->bytesUsed = 0;
    allocation->nextAllocation = this->allocations;
    allocation->recorded = false;
    allocation->inPrereservedRegion = isAllJITCodeInPreReservedRegion;

    this->allocations = allocation;

#if DBG_DUMP
    this->totalBytesCommitted += heapAllocation->size;
#endif

    return allocation;
}